

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O0

int npf_vsnprintf(char *buffer,size_t bufsz,char *format,__va_list_tag *vlist)

{
  int iVar1;
  npf_putc local_58;
  int n;
  npf_putc pc;
  npf_bufputc_ctx_t bufputc_ctx;
  __va_list_tag *vlist_local;
  char *format_local;
  size_t bufsz_local;
  char *buffer_local;
  
  bufputc_ctx.len = 0;
  if (buffer == (char *)0x0) {
    local_58 = npf_bufputc_nop;
  }
  else {
    local_58 = npf_bufputc;
  }
  pc = (npf_putc)buffer;
  bufputc_ctx.dst = (char *)bufsz;
  bufputc_ctx.cur = (size_t)vlist;
  iVar1 = npf_vpprintf(local_58,&pc,format,vlist);
  (*local_58)(0,&pc);
  if ((buffer != (char *)0x0) && (bufsz != 0)) {
    buffer[bufsz - 1] = '\0';
  }
  return iVar1;
}

Assistant:

int npf_vsnprintf(char *buffer, size_t bufsz, char const *format, va_list vlist) {
  npf_bufputc_ctx_t bufputc_ctx;
  bufputc_ctx.dst = buffer;
  bufputc_ctx.len = bufsz;
  bufputc_ctx.cur = 0;

  npf_putc const pc = buffer ? npf_bufputc : npf_bufputc_nop;
  int const n = npf_vpprintf(pc, &bufputc_ctx, format, vlist);
  pc('\0', &bufputc_ctx);

  if (buffer && bufsz) {
#ifdef NANOPRINTF_SNPRINTF_SAFE_EMPTY_STRING_ON_OVERFLOW
    if (n >= (int)bufsz) { buffer[0] = '\0'; }
#else
    buffer[bufsz - 1] = '\0';
#endif
  }

  return n;
}